

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O2

void lj_err_run(lua_State *L)

{
  uint *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  int errcode;
  GCstr *pGVar5;
  TValue *pTVar6;
  void *pvVar7;
  long lVar8;
  
  uVar2 = (L->glref).ptr64;
  if (*(long *)(uVar2 + 0x178) != 0) {
LAB_00109c85:
    errcode = 2;
LAB_00109c87:
    lj_err_throw(L,errcode);
  }
  uVar3 = (L->stack).ptr64;
  pTVar6 = L->base + -1;
  pvVar7 = L->cframe;
LAB_00109bcf:
  do {
    if (pTVar6 <= (TValue *)(uVar3 + 8)) goto LAB_00109c85;
    while( true ) {
      if (pvVar7 == (void *)0x0) goto LAB_00109c85;
      if ((-1 < *(int *)(((ulong)pvVar7 & 0xfffffffffffffffc) + 8)) ||
         ((TValue *)(uVar3 - (long)*(int *)((long)pvVar7 + 8)) <= pTVar6)) break;
      lVar8 = (long)*(int *)((long)pvVar7 + 0xc);
      if (-1 < lVar8) goto LAB_00109c80;
      pvVar7 = *(void **)((long)pvVar7 + 0x20);
    }
    uVar4 = pTVar6->u64;
    switch((uint)uVar4 & 7) {
    default:
      pTVar6 = pTVar6 + (-2 - (ulong)*(byte *)(uVar4 - 3));
      goto LAB_00109bcf;
    case 1:
switchD_00109c1e_caseD_1:
      pvVar7 = *(void **)((long)pvVar7 + 0x20);
      break;
    case 2:
      if (pTVar6[-3].u64 == 1) goto switchD_00109c1e_caseD_1;
      break;
    case 3:
      break;
    case 5:
      if (((ulong)pvVar7 & 1) == 0) {
        lVar8 = (long)*(int *)((long)pvVar7 + 0xc);
        if (lVar8 < 0) goto switchD_00109c1e_caseD_1;
        goto LAB_00109c80;
      }
      goto LAB_00109c85;
    case 6:
    case 7:
      if (*(char *)((*(ulong *)((long)pTVar6 + (-8 - (uVar4 & 0xfffffffffffffff8))) & 0x7fffffffffff
                    ) + 10) == '\x15') {
        lVar8 = (long)pTVar6 + (-uVar3 - (uVar4 & 0xfffffffffffffff8)) + 8;
LAB_00109c80:
        if (lVar8 != 0) {
          pTVar6 = L->top;
          puVar1 = (uint *)(uVar2 + 0x3cc);
          *puVar1 = *puVar1 & 0xffffffef;
          if (((uint)((ulong)*(undefined8 *)(uVar3 + lVar8) >> 0x2f) != 0x1fff7) ||
             (L->status == '\x05')) {
            pGVar5 = lj_err_str(L,LJ_ERR_ERRERR);
            pTVar6[-1].u64 = (ulong)pGVar5 | 0xfffd800000000000;
            errcode = 5;
            goto LAB_00109c87;
          }
          L->status = '\x05';
          pTVar6[1] = pTVar6[-1];
          pTVar6[-1] = *(TValue *)(uVar3 + lVar8);
          pTVar6->u64 = 0xffffffffffffffff;
          L->top = pTVar6 + 2;
          lj_vm_call(L,pTVar6 + 1,2);
        }
      }
      goto LAB_00109c85;
    }
    pTVar6 = (TValue *)((long)pTVar6 - (uVar4 & 0xfffffffffffffff8));
  } while( true );
}

Assistant:

LJ_FASTCALL lj_err_run(lua_State *L)
{
  ptrdiff_t ef = (LJ_HASJIT && tvref(G(L)->jit_base)) ? 0 : finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top+LJ_FR2, top-1);
    copyTV(L, top-1, errfunc);
    if (LJ_FR2) setnilV(top++);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}